

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slhdsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d2eb::SLHDSATest_BasicNonstandardPrehashSignVerify_Test::TestBody
          (SLHDSATest_BasicNonstandardPrehashSignVerify_Test *this)

{
  int iVar1;
  char *pcVar2;
  uint8_t *expected_predicate_value;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  AssertionResult gtest_ar__2;
  uint8_t kWrongLengthHash [16];
  AssertHelper local_2088;
  AssertionResult gtest_ar;
  AssertHelper local_2060;
  uint8_t pub [32];
  uint8_t kHashedMessage [48];
  uint8_t priv [64];
  uint8_t kContext [256];
  uint8_t signature [7856];
  
  SLHDSA_SHA2_128S_generate_key(pub,priv);
  kHashedMessage[8] = '\0';
  kHashedMessage[9] = '\0';
  kHashedMessage[10] = '\0';
  kHashedMessage[0xb] = '\0';
  kHashedMessage[0xc] = '\0';
  kHashedMessage[0xd] = '\0';
  kHashedMessage[0xe] = '\0';
  kHashedMessage[0xf] = '\0';
  kHashedMessage[0x20] = '\0';
  kHashedMessage[0x21] = '\0';
  kHashedMessage[0x22] = '\0';
  kHashedMessage[0x23] = '\0';
  kHashedMessage[0x24] = '\0';
  kHashedMessage[0x25] = '\0';
  kHashedMessage[0x26] = '\0';
  kHashedMessage[0x27] = '\0';
  kHashedMessage[0x28] = '\0';
  kHashedMessage[0x29] = '\0';
  kHashedMessage[0x2a] = '\0';
  kHashedMessage[0x2b] = '\0';
  kHashedMessage[0x2c] = '\0';
  kHashedMessage[0x2d] = '\0';
  kHashedMessage[0x2e] = '\0';
  kHashedMessage[0x2f] = '\0';
  kHashedMessage[0x10] = '\0';
  kHashedMessage[0x11] = '\0';
  kHashedMessage[0x12] = '\0';
  kHashedMessage[0x13] = '\0';
  kHashedMessage[0x14] = '\0';
  kHashedMessage[0x15] = '\0';
  kHashedMessage[0x16] = '\0';
  kHashedMessage[0x17] = '\0';
  kHashedMessage[0x18] = '\0';
  kHashedMessage[0x19] = '\0';
  kHashedMessage[0x1a] = '\0';
  kHashedMessage[0x1b] = '\0';
  kHashedMessage[0x1c] = '\0';
  kHashedMessage[0x1d] = '\0';
  kHashedMessage[0x1e] = '\0';
  kHashedMessage[0x1f] = '\0';
  kHashedMessage[0] = 'B';
  kHashedMessage[1] = '\0';
  kHashedMessage[2] = '\0';
  kHashedMessage[3] = '\0';
  kHashedMessage[4] = '\0';
  kHashedMessage[5] = '\0';
  kHashedMessage[6] = '\0';
  kHashedMessage[7] = '\0';
  memset(kContext,0,0x100);
  pcVar2 = (char *)0x0;
  iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                    (signature,priv,kHashedMessage,0x30,0x2a1,(uint8_t *)0x0,0);
  kWrongLengthHash[8] = '\0';
  kWrongLengthHash[9] = '\0';
  kWrongLengthHash[10] = '\0';
  kWrongLengthHash[0xb] = '\0';
  kWrongLengthHash[0xc] = '\0';
  kWrongLengthHash[0xd] = '\0';
  kWrongLengthHash[0xe] = '\0';
  kWrongLengthHash[0xf] = '\0';
  kWrongLengthHash[0] = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)kWrongLengthHash,
               (AssertionResult *)
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kHashedMessage, sizeof(kHashedMessage), 673, nullptr, 0)"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_2088,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x60,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_2088,(Message *)&gtest_ar__2);
LAB_0031c770:
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(kWrongLengthHash + 8);
    testing::internal::AssertHelper::~AssertHelper(&local_2088);
    std::__cxx11::string::~string((string *)&gtest_ar);
    local_2088.data_ = (AssertHelperData *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(kWrongLengthHash + 8));
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (signature,0x1eb0,pub,kHashedMessage,0x30,0x2a1,(uint8_t *)0x0,0);
    kWrongLengthHash[0] = (char)iVar1;
    kWrongLengthHash[1] = (char)((uint)iVar1 >> 8);
    kWrongLengthHash[2] = (char)((uint)iVar1 >> 0x10);
    kWrongLengthHash[3] = (char)((uint)iVar1 >> 0x18);
    gtest_ar__2.success_ = true;
    gtest_ar__2._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, nullptr, 0)"
               ,"1",(int *)kWrongLengthHash,(int *)&gtest_ar__2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)kWrongLengthHash);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,100,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)kWrongLengthHash);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if (kWrongLengthHash._0_8_ != 0) {
        (**(code **)(*(long *)kWrongLengthHash._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (signature,0x1eb0,pub,kHashedMessage,0x30,0x2a1,kContext,1);
    kWrongLengthHash[0] = (char)iVar1;
    kWrongLengthHash[1] = (char)((uint)iVar1 >> 8);
    kWrongLengthHash[2] = (char)((uint)iVar1 >> 0x10);
    kWrongLengthHash[3] = (char)((uint)iVar1 >> 0x18);
    gtest_ar__2.success_ = false;
    gtest_ar__2._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
               ,"0",(int *)kWrongLengthHash,(int *)&gtest_ar__2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)kWrongLengthHash);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x68,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)kWrongLengthHash);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if (kWrongLengthHash._0_8_ != 0) {
        (**(code **)(*(long *)kWrongLengthHash._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (signature,0x1eb0,pub,kHashedMessage,0x30,0x2a1,kContext,0x100);
    kWrongLengthHash[0] = (char)iVar1;
    kWrongLengthHash[1] = (char)((uint)iVar1 >> 8);
    kWrongLengthHash[2] = (char)((uint)iVar1 >> 0x10);
    kWrongLengthHash[3] = (char)((uint)iVar1 >> 0x18);
    gtest_ar__2.success_ = false;
    gtest_ar__2._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 256)"
               ,"0",(int *)kWrongLengthHash,(int *)&gtest_ar__2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)kWrongLengthHash);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x6c,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)kWrongLengthHash);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if (kWrongLengthHash._0_8_ != 0) {
        (**(code **)(*(long *)kWrongLengthHash._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    expected_predicate_value = kContext;
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                      (signature,priv,kHashedMessage,0x30,0x2a1,kContext,1);
    kWrongLengthHash[8] = '\0';
    kWrongLengthHash[9] = '\0';
    kWrongLengthHash[10] = '\0';
    kWrongLengthHash[0xb] = '\0';
    kWrongLengthHash[0xc] = '\0';
    kWrongLengthHash[0xd] = '\0';
    kWrongLengthHash[0xe] = '\0';
    kWrongLengthHash[0xf] = '\0';
    kWrongLengthHash[0] = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&gtest_ar__2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)kWrongLengthHash,
                 (AssertionResult *)
                 "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
                 ,"false","true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_2088,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x70,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_2088,(Message *)&gtest_ar__2);
      goto LAB_0031c770;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(kWrongLengthHash + 8));
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (signature,0x1eb0,pub,kHashedMessage,0x30,0x2a1,kContext,1);
    kWrongLengthHash[0] = (char)iVar1;
    kWrongLengthHash[1] = (char)((uint)iVar1 >> 8);
    kWrongLengthHash[2] = (char)((uint)iVar1 >> 0x10);
    kWrongLengthHash[3] = (char)((uint)iVar1 >> 0x18);
    gtest_ar__2.success_ = true;
    gtest_ar__2._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
               ,"1",(int *)kWrongLengthHash,(int *)&gtest_ar__2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)kWrongLengthHash);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x74,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)kWrongLengthHash);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if (kWrongLengthHash._0_8_ != 0) {
        (**(code **)(*(long *)kWrongLengthHash._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    kWrongLengthHash[0] = 'B';
    kWrongLengthHash[1] = '\0';
    kWrongLengthHash[2] = '\0';
    kWrongLengthHash[3] = '\0';
    kWrongLengthHash[4] = '\0';
    kWrongLengthHash[5] = '\0';
    kWrongLengthHash[6] = '\0';
    kWrongLengthHash[7] = '\0';
    kWrongLengthHash[8] = '\0';
    kWrongLengthHash[9] = '\0';
    kWrongLengthHash[10] = '\0';
    kWrongLengthHash[0xb] = '\0';
    kWrongLengthHash[0xc] = '\0';
    kWrongLengthHash[0xd] = '\0';
    kWrongLengthHash[0xe] = '\0';
    kWrongLengthHash[0xf] = '\0';
    pcVar2 = (char *)0x0;
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                      (signature,priv,kWrongLengthHash,0x10,0x2a1,(uint8_t *)0x0,0);
    this_00 = &gtest_ar__2.message_;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__2.success_ = iVar1 == 0;
    if (iVar1 == 0) goto LAB_0031c8a3;
    testing::Message::Message((Message *)&local_2088);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,
               (AssertionResult *)
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kWrongLengthHash, sizeof(kWrongLengthHash), 673, nullptr, 0)"
               ,"true","false",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_2060,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x79,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_2060,(Message *)&local_2088);
    testing::internal::AssertHelper::~AssertHelper(&local_2060);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  if (local_2088.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_2088.data_ + 8))();
  }
LAB_0031c8a3:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(SLHDSATest, BasicNonstandardPrehashSignVerify) {
  uint8_t pub[SLHDSA_SHA2_128S_PUBLIC_KEY_BYTES];
  uint8_t priv[SLHDSA_SHA2_128S_PRIVATE_KEY_BYTES];
  SLHDSA_SHA2_128S_generate_key(pub, priv);

  // Use a constant 48-byte value as the prehashed message
  uint8_t kHashedMessage[48] = {0x42};
  uint8_t kContext[256] = {0};
  uint8_t signature[SLHDSA_SHA2_128S_SIGNATURE_BYTES];
  ASSERT_TRUE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kHashedMessage, sizeof(kHashedMessage), NID_sha384,
      nullptr, 0));
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, nullptr, 0),
            1);
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 1),
            0);
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 256),
            0);

  ASSERT_TRUE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kHashedMessage, sizeof(kHashedMessage), NID_sha384,
      kContext, 1));
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 1),
            1);

  uint8_t kWrongLengthHash[16] = {0x42};
  EXPECT_FALSE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kWrongLengthHash, sizeof(kWrongLengthHash), NID_sha384,
      nullptr, 0));
}